

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

Pos getLinkedGatewayPos(EndNoise *en,SurfaceNoise *sn,uint64_t seed,Pos src)

{
  Pos PVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Pos PVar7;
  ulong uVar8;
  long in_RDI;
  double dVar9;
  float v;
  Pos sp;
  uint64_t dr;
  uint64_t dz;
  uint64_t dx;
  int v_1;
  uint64_t d;
  Pos c;
  int j;
  int i;
  int ymin;
  float y [1089];
  Pos dst;
  float local_1184;
  Pos *in_stack_ffffffffffffee98;
  undefined4 in_stack_ffffffffffffeea0;
  undefined4 in_stack_ffffffffffffeea4;
  SurfaceNoise *in_stack_ffffffffffffeea8;
  ulong uVar10;
  undefined4 in_stack_ffffffffffffeeb0;
  undefined4 in_stack_ffffffffffffeeb4;
  int in_stack_ffffffffffffeeb8;
  int in_stack_ffffffffffffeebc;
  int iVar11;
  int local_1140;
  int iVar12;
  int in_stack_ffffffffffffeec8;
  int in_stack_ffffffffffffeecc;
  uint64_t in_stack_ffffffffffffeed0;
  EndNoise *in_stack_ffffffffffffeed8;
  float *in_stack_ffffffffffffeee0;
  int in_stack_ffffffffffffef0c;
  int in_stack_ffffffffffffef10;
  int in_stack_ffffffffffffef14;
  SurfaceNoise *in_stack_ffffffffffffef18;
  EndNoise *in_stack_ffffffffffffef20;
  float *in_stack_ffffffffffffef28;
  int in_stack_ffffffffffffef30;
  int in_stack_ffffffffffffef38;
  int in_stack_ffffffffffffef90;
  int in_stack_ffffffffffffef98;
  int in_stack_ffffffffffffefa0;
  int local_8;
  int iStack_4;
  
  iVar12 = 0;
  PVar7.z = in_stack_ffffffffffffeebc;
  PVar7.x = in_stack_ffffffffffffeeb8;
  PVar7 = getLinkedGatewayChunk
                    ((EndNoise *)CONCAT44(in_stack_ffffffffffffeeb4,in_stack_ffffffffffffeeb0),
                     in_stack_ffffffffffffeea8,
                     CONCAT44(in_stack_ffffffffffffeea4,in_stack_ffffffffffffeea0),PVar7,
                     in_stack_ffffffffffffee98);
  iVar5 = PVar7.x;
  iVar6 = PVar7.z;
  if (*(int *)(in_RDI + 0x140) < 0x15) {
    mapEndSurfaceHeight(in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,
                        in_stack_ffffffffffffef18,in_stack_ffffffffffffef14,
                        in_stack_ffffffffffffef10,in_stack_ffffffffffffef0c,
                        in_stack_ffffffffffffef90,in_stack_ffffffffffffef98,
                        in_stack_ffffffffffffefa0);
    mapEndIslandHeight(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0
                       ,in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8,iVar12,
                       in_stack_ffffffffffffef30,in_stack_ffffffffffffef38);
    uVar10 = 0;
    for (iVar11 = 0; iVar11 < 0x10; iVar11 = iVar11 + 1) {
      for (local_1140 = 0; local_1140 < 0x10; local_1140 = local_1140 + 1) {
        iVar2 = (int)*(float *)(&stack0xffffffffffffeec8 + (long)(iVar11 * 0x10 + local_1140) * 4);
        if (0x1d < iVar2) {
          iVar3 = iVar5 * 0x10 + local_1140;
          iVar4 = iVar6 * 0x10 + iVar11;
          uVar8 = (long)iVar3 * (long)iVar3 + (long)iVar4 * (long)iVar4 + (long)(iVar2 * iVar2);
          if (uVar10 < uVar8) {
            uVar10 = uVar8;
            local_8 = iVar3;
            iStack_4 = iVar4;
          }
        }
      }
    }
    for (local_1140 = 0; local_1140 < 0x100; local_1140 = local_1140 + 1) {
      if ((float)iVar12 < *(float *)(&stack0xffffffffffffeec8 + (long)local_1140 * 4)) {
        dVar9 = floor((double)*(float *)(&stack0xffffffffffffeec8 + (long)local_1140 * 4));
        iVar12 = (int)dVar9;
      }
    }
  }
  else {
    local_8 = iVar5 * 0x10 + 0xf;
    iStack_4 = iVar6 * 0x10 + 0xf;
  }
  iVar5 = local_8 + -0x10;
  iVar6 = iStack_4 + -0x10;
  memset(&stack0xffffffffffffeec8,0,0x1104);
  mapEndIslandHeight(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                     in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8,iVar12,
                     in_stack_ffffffffffffef30,in_stack_ffffffffffffef38);
  for (local_1140 = 0; local_1140 < 0x441; local_1140 = local_1140 + 1) {
    if ((float)iVar12 < *(float *)(&stack0xffffffffffffeec8 + (long)local_1140 * 4)) {
      dVar9 = floor((double)*(float *)(&stack0xffffffffffffeec8 + (long)local_1140 * 4));
      iVar12 = (int)dVar9;
    }
  }
  mapEndSurfaceHeight(in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,in_stack_ffffffffffffef18,
                      in_stack_ffffffffffffef14,in_stack_ffffffffffffef10,in_stack_ffffffffffffef0c,
                      in_stack_ffffffffffffef90,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0)
  ;
  mapEndIslandHeight(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                     in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8,iVar12,
                     in_stack_ffffffffffffef30,in_stack_ffffffffffffef38);
  local_1184 = -1.0;
  for (local_1140 = 0; local_1140 < 0x21; local_1140 = local_1140 + 1) {
    for (iVar12 = 0; iVar12 < 0x21; iVar12 = iVar12 + 1) {
      if (local_1184 < *(float *)(&stack0xffffffffffffeec8 + (long)(iVar12 * 0x21 + local_1140) * 4)
         ) {
        local_1184 = *(float *)(&stack0xffffffffffffeec8 + (long)(iVar12 * 0x21 + local_1140) * 4);
        local_8 = iVar5 + local_1140;
        iStack_4 = iVar6 + iVar12;
      }
    }
  }
  PVar1.z = iStack_4;
  PVar1.x = local_8;
  return PVar1;
}

Assistant:

Pos getLinkedGatewayPos(const EndNoise *en, const SurfaceNoise *sn, uint64_t seed, Pos src)
{
    float y[33*33]; // buffer for [16][16] and [33][33]
    int ymin = 0;
    int i, j;

    Pos dst;
    Pos c = getLinkedGatewayChunk(en, sn, seed, src, &dst);

    if (en->mc > MC_1_16)
    {
        // The original java implementation has a bug where the result
        // variable for the in-chunk block search is assigned a reference
        // to the mutable iterator, which ends up as the last iteration
        // position and discards the found location.
        dst.x = c.x * 16 + 15;
        dst.z = c.z * 16 + 15;
    }
    else
    {
        mapEndSurfaceHeight(y, en, sn, c.x*16, c.z*16, 16, 16, 1, 30);
        mapEndIslandHeight(y, en, seed, c.x*16, c.z*16, 16, 16, 1);

        uint64_t d = 0;
        for (j = 0; j < 16; j++)
        {
            for (i = 0; i < 16; i++)
            {
                int v = (int) y[j*16 + i];
                if (v < 30) continue;
                uint64_t dx = 16*c.x + i;
                uint64_t dz = 16*c.z + j;
                uint64_t dr = dx*dx + dz*dz + v*v;
                if (dr > d)
                {
                    d = dr;
                    dst.x = dx;
                    dst.z = dz;
                }
            }
        }
        // use the previous result to retrieve the minimum y-level we know,
        // we can skip generation of surfaces that are lower than this
        for (i = 0; i < 16*16; i++)
            if (y[i] > ymin)
                ymin = (int) floor(y[i]);
    }

    Pos sp = { dst.x-16, dst.z-16 };
    // checking end islands is much cheaper than surface height generation, so
    // we can also skip surface generation lower than the highest island around
    memset(y, 0, sizeof(float)*33*33);
    mapEndIslandHeight(y, en, seed, sp.x, sp.z, 33, 33, 1);
    for (i = 0; i < 33*33; i++)
        if (y[i] > ymin)
            ymin = (int) floor(y[i]);

    mapEndSurfaceHeight(y, en, sn, sp.x, sp.z, 33, 33, 1, ymin);
    mapEndIslandHeight(y, en, seed, sp.x, sp.z, 33, 33, 1);

    float v = -1;
    for (i = 0; i < 33; i++)
    {
        for (j = 0; j < 33; j++)
        {
            if (y[j*33 + i] <= v)
                continue;
            v = y[j*33 + i];
            dst.x = sp.x + i;
            dst.z = sp.z + j;
        }
    }

    return dst;
}